

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3OpenMasterTable(Parse *p,int iDb)

{
  Op *pOVar1;
  int iVar2;
  Vdbe *p_00;
  
  p_00 = sqlite3GetVdbe(p);
  sqlite3TableLock(p,iDb,1,'\x01',"sqlite_master");
  iVar2 = sqlite3VdbeAddOp3(p_00,0x6e,0,1,iDb);
  if (p_00->db->mallocFailed == '\0') {
    pOVar1 = p_00->aOp;
    pOVar1[iVar2].p4type = -3;
    pOVar1[iVar2].p4.i = 5;
  }
  if (p->nTab == 0) {
    p->nTab = 1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3OpenMasterTable(Parse *p, int iDb){
  Vdbe *v = sqlite3GetVdbe(p);
  sqlite3TableLock(p, iDb, MASTER_ROOT, 1, MASTER_NAME);
  sqlite3VdbeAddOp4Int(v, OP_OpenWrite, 0, MASTER_ROOT, iDb, 5);
  if( p->nTab==0 ){
    p->nTab = 1;
  }
}